

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoConvert<long,float>(Thread *this,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  long value;
  allocator local_a1;
  string local_a0;
  Ptr local_80;
  allocator local_61;
  string local_60;
  Ptr local_40;
  f32 local_24;
  Ptr *pPStack_20;
  float val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pPStack_20 = out_trap;
  out_trap_local = (Ptr *)this;
  local_24 = (f32)Pop<float>(this);
  bVar2 = IsNaN<float,_0>((float)local_24);
  if (bVar2) {
    pSVar1 = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"invalid conversion to integer",&local_61);
    Trap::New(&local_40,pSVar1,&local_60,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=(pPStack_20,&local_40);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  else {
    bVar2 = CanConvert<long,float>(local_24);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      value = Convert<long,float>((float)local_24);
      Push<long>(this,value);
      this_local._4_4_ = Ok;
    }
    else {
      pSVar1 = this->store_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a0,"integer overflow",&local_a1);
      Trap::New(&local_80,pSVar1,&local_a0,&this->frames_);
      RefPtr<wabt::interp::Trap>::operator=(pPStack_20,&local_80);
      this_local._4_4_ = Trap;
      RefPtr<wabt::interp::Trap>::~RefPtr(&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}